

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> * __thiscall
Parser::statements(vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>
                   *__return_storage_ptr__,Parser *this)

{
  initializer_list<TokenType> __l;
  bool bVar1;
  undefined1 local_78 [40];
  TokenType local_50 [2];
  iterator local_48;
  size_type local_40;
  vector<TokenType,_std::allocator<TokenType>_> local_38;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> *statList;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::vector
            (__return_storage_ptr__);
  while( true ) {
    local_50[0] = RightCurly;
    local_50[1] = 0x42;
    local_48 = local_50;
    local_40 = 2;
    std::allocator<TokenType>::allocator((allocator<TokenType> *)(local_78 + 0x27));
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::vector<TokenType,_std::allocator<TokenType>_>::vector
              (&local_38,__l,(allocator<TokenType> *)(local_78 + 0x27));
    bVar1 = matchAny(this,&local_38);
    std::vector<TokenType,_std::allocator<TokenType>_>::~vector(&local_38);
    std::allocator<TokenType>::~allocator((allocator<TokenType> *)(local_78 + 0x27));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    statement((Parser *)local_78);
    std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::push_back
              (__return_storage_ptr__,(value_type *)local_78);
    std::shared_ptr<Statement>::~shared_ptr((shared_ptr<Statement> *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ptr<Statement>> Parser::statements() {
    std::vector<ptr<Statement>> statList;
    while(!matchAny({ TokenType::RightCurly, TokenType::EndOfFile }))
        statList.push_back(statement());
    return statList;
}